

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_ssse3.c
# Opt level: O1

void cfl_subsample_lbd_420_8x4_ssse3(uint8_t *cfl_type,int input_stride,uint16_t *output_q3)

{
  undefined1 auVar1 [16];
  __m128i *pred_buf_m128i;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  auVar1 = _DAT_0056a300;
  lVar2 = 0;
  do {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = *(ulong *)cfl_type;
    auVar3 = pmaddubsw(auVar3,auVar1);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = *(ulong *)((long)cfl_type + (long)input_stride);
    auVar4 = pmaddubsw(auVar4,auVar1);
    *(ulong *)((long)output_q3 + lVar2) =
         CONCAT26(auVar4._6_2_ + auVar3._6_2_,
                  CONCAT24(auVar4._4_2_ + auVar3._4_2_,
                           CONCAT22(auVar4._2_2_ + auVar3._2_2_,auVar4._0_2_ + auVar3._0_2_)));
    cfl_type = (uint8_t *)((long)cfl_type + (long)(input_stride * 2));
    lVar2 = lVar2 + 0x40;
  } while (lVar2 == 0x40);
  return;
}

Assistant:

static inline void cfl_luma_subsampling_420_lbd_ssse3(const uint8_t *input,
                                                      int input_stride,
                                                      uint16_t *pred_buf_q3,
                                                      int width, int height) {
  const __m128i twos = _mm_set1_epi8(2);
  __m128i *pred_buf_m128i = (__m128i *)pred_buf_q3;
  const __m128i *end = pred_buf_m128i + (height >> 1) * CFL_BUF_LINE_I128;
  const int luma_stride = input_stride << 1;
  do {
    if (width == 4) {
      __m128i top = _mm_loadh_epi32((__m128i *)input);
      top = _mm_maddubs_epi16(top, twos);
      __m128i bot = _mm_loadh_epi32((__m128i *)(input + input_stride));
      bot = _mm_maddubs_epi16(bot, twos);
      const __m128i sum = _mm_add_epi16(top, bot);
      _mm_storeh_epi32(pred_buf_m128i, sum);
    } else if (width == 8) {
      __m128i top = _mm_loadl_epi64((__m128i *)input);
      top = _mm_maddubs_epi16(top, twos);
      __m128i bot = _mm_loadl_epi64((__m128i *)(input + input_stride));
      bot = _mm_maddubs_epi16(bot, twos);
      const __m128i sum = _mm_add_epi16(top, bot);
      _mm_storel_epi64(pred_buf_m128i, sum);
    } else {
      __m128i top = _mm_loadu_si128((__m128i *)input);
      top = _mm_maddubs_epi16(top, twos);
      __m128i bot = _mm_loadu_si128((__m128i *)(input + input_stride));
      bot = _mm_maddubs_epi16(bot, twos);
      const __m128i sum = _mm_add_epi16(top, bot);
      _mm_storeu_si128(pred_buf_m128i, sum);
      if (width == 32) {
        __m128i top_1 = _mm_loadu_si128(((__m128i *)input) + 1);
        __m128i bot_1 =
            _mm_loadu_si128(((__m128i *)(input + input_stride)) + 1);
        top_1 = _mm_maddubs_epi16(top_1, twos);
        bot_1 = _mm_maddubs_epi16(bot_1, twos);
        __m128i sum_1 = _mm_add_epi16(top_1, bot_1);
        _mm_storeu_si128(pred_buf_m128i + 1, sum_1);
      }
    }
    input += luma_stride;
    pred_buf_m128i += CFL_BUF_LINE_I128;
  } while (pred_buf_m128i < end);
}